

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::dumpSourceInstructions
          (Builder *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *out)

{
  Id fileId;
  bool bVar1;
  pointer ppVar2;
  _Self local_28;
  _Self local_20;
  const_iterator iItr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *out_local;
  Builder *this_local;
  
  if ((this->emitNonSemanticShaderDebugInfo & 1U) == 0) {
    iItr._M_node = (_Base_ptr)out;
    dumpSourceInstructions(this,this->mainFileId,&this->sourceText,out);
    local_20._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
         ::begin(&this->includeFiles);
    while( true ) {
      local_28._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
           ::end(&this->includeFiles);
      bVar1 = std::operator!=(&local_20,&local_28);
      if (!bVar1) break;
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
               ::operator->(&local_20);
      fileId = ppVar2->first;
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
               ::operator->(&local_20);
      dumpSourceInstructions
                (this,fileId,ppVar2->second,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)iItr._M_node);
      std::
      _Rb_tree_const_iterator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
      ::operator++(&local_20);
    }
  }
  return;
}

Assistant:

void Builder::dumpSourceInstructions(std::vector<unsigned int>& out) const
{
    if (emitNonSemanticShaderDebugInfo) return;
    dumpSourceInstructions(mainFileId, sourceText, out);
    for (auto iItr = includeFiles.begin(); iItr != includeFiles.end(); ++iItr)
        dumpSourceInstructions(iItr->first, *iItr->second, out);
}